

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

internal_node<char,_false> *
immutable::rrb_details::internal_node_copy<char,false>
          (internal_node<char,_false> *original,uint32_t start,uint32_t len)

{
  internal_node<char,_false> *piVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)start;
  piVar1 = internal_node_create<char,false>(len);
  for (lVar3 = 0; (ulong)len << 3 != lVar3; lVar3 = lVar3 + 8) {
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
               ((long)&piVar1->child->ptr + lVar3),original->child + uVar2);
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  return piVar1;
}

Assistant:

inline internal_node<T, atomic_ref_counting>* internal_node_copy(const internal_node<T, atomic_ref_counting>* original, uint32_t start, uint32_t len)
      {
      internal_node<T, atomic_ref_counting>* node = internal_node_create<T, atomic_ref_counting>(len);
      for (uint32_t i = 0; i < len; ++i)
        node->child[i] = original->child[i + start];
      return node;
      }